

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O0

void __thiscall
google::protobuf::internal::InternalMetadataWithArena::DoSwap
          (InternalMetadataWithArena *this,UnknownFieldSet *other)

{
  UnknownFieldSet *in_RSI;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *in_RDI;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *unaff_retaddr;
  
  if (((uint)*(undefined8 *)in_RDI & 1) == 1) {
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
    ::
    PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
              (in_RDI);
  }
  else {
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    ::mutable_unknown_fields_slow(unaff_retaddr);
  }
  UnknownFieldSet::Swap(in_RSI,(UnknownFieldSet *)in_RDI);
  return;
}

Assistant:

void DoSwap(UnknownFieldSet* other) { mutable_unknown_fields()->Swap(other); }